

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.cpp
# Opt level: O0

int __thiscall
CSnapshotDelta::UnpackDelta
          (CSnapshotDelta *this,CSnapshot *pFrom,CSnapshot *pTo,void *pSrcData,int DataSize)

{
  undefined4 *puVar1;
  long lVar2;
  undefined1 *puVar3;
  int iVar4;
  CSnapshotItem *pCVar5;
  void *pvVar6;
  int *piVar7;
  undefined1 *puVar8;
  long in_FS_OFFSET;
  int i_1;
  int d;
  int i;
  int *pNewData;
  int FromIndex;
  int Key;
  int Type;
  int ID;
  int *pDeleted;
  int ItemSize;
  int Keep;
  CSnapshotItem *pFromItem;
  int *pEnd;
  int *pData;
  CData *pDelta;
  int DataSize_local;
  void *pSrcData_local;
  CSnapshot *pTo_local;
  CSnapshot *pFrom_local;
  CSnapshotDelta *this_local;
  CSnapshotBuilder Builder;
  
  puVar3 = (undefined1 *)register0x00000020;
  do {
    puVar8 = puVar3;
    *(undefined8 *)(puVar8 + -0x1000) = 0;
    puVar3 = puVar8 + -0x1000;
  } while (puVar8 + -0x1000 != Builder.m_aData + 0x10);
  *(undefined8 *)(puVar8 + 0xfff8) = *(undefined8 *)(in_FS_OFFSET + 0x28);
  *(CSnapshotDelta **)(puVar8 + -0x1020) = this;
  *(CSnapshot **)(puVar8 + -0x1028) = pFrom;
  *(CSnapshot **)(puVar8 + -0x1030) = pTo;
  *(void **)(puVar8 + -0x1038) = pSrcData;
  *(int *)(puVar8 + -0x103c) = DataSize;
  *(undefined8 *)(puVar8 + -0x10a0) = *(undefined8 *)(puVar8 + -0x1020);
  *(undefined8 *)(puVar8 + -0x1048) = *(undefined8 *)(puVar8 + -0x1038);
  *(long *)(puVar8 + -0x1050) = *(long *)(puVar8 + -0x1048) + 0xc;
  *(long *)(puVar8 + -0x1058) = *(long *)(puVar8 + -0x1038) + (long)*(int *)(puVar8 + -0x103c);
  *(undefined8 *)(puVar8 + -0x10d0) = 0x15c745;
  CSnapshotBuilder::Init((CSnapshotBuilder *)(puVar8 + -0x1010));
  *(undefined8 *)(puVar8 + -0x1070) = *(undefined8 *)(puVar8 + -0x1050);
  if (**(int **)(puVar8 + -0x1048) < 0) {
    *(undefined4 *)(puVar8 + -0x1014) = 0xffffffff;
  }
  else {
    *(long *)(puVar8 + -0x1050) =
         *(long *)(puVar8 + -0x1050) + (long)**(int **)(puVar8 + -0x1048) * 4;
    if (*(ulong *)(puVar8 + -0x1058) < *(ulong *)(puVar8 + -0x1050)) {
      *(undefined4 *)(puVar8 + -0x1014) = 0xffffffff;
    }
    else {
      *(undefined4 *)(puVar8 + -0x108c) = 0;
      while( true ) {
        *(undefined4 *)(puVar8 + -0x10a4) = *(undefined4 *)(puVar8 + -0x108c);
        *(undefined8 *)(puVar8 + -0x10d0) = 0x15c7c3;
        iVar4 = CSnapshot::NumItems(*(CSnapshot **)(puVar8 + -0x1028));
        if (iVar4 <= *(int *)(puVar8 + -0x10a4)) break;
        *(undefined8 *)(puVar8 + -0x10d0) = 0x15c7e2;
        pCVar5 = CSnapshot::GetItem(*(CSnapshot **)(puVar8 + -0x10b0),*(int *)(puVar8 + -0x10b4));
        *(CSnapshotItem **)(puVar8 + -0x1060) = pCVar5;
        *(undefined8 *)(puVar8 + -0x10d0) = 0x15c7f8;
        iVar4 = CSnapshot::GetItemSize(*(CSnapshot **)(puVar8 + -0x10b8),*(int *)(puVar8 + -0x10bc))
        ;
        *(int *)(puVar8 + -0x1068) = iVar4;
        *(undefined4 *)(puVar8 + -0x1064) = 1;
        *(undefined4 *)(puVar8 + -0x1090) = 0;
        while (*(int *)(puVar8 + -0x1090) < **(int **)(puVar8 + -0x1048)) {
          *(undefined4 *)(puVar8 + -0x10a8) =
               *(undefined4 *)(*(long *)(puVar8 + -0x1070) + (long)*(int *)(puVar8 + -0x1090) * 4);
          *(undefined8 *)(puVar8 + -0x10d0) = 0x15c837;
          iVar4 = CSnapshotItem::Key(*(CSnapshotItem **)(puVar8 + -0x1060));
          if (*(int *)(puVar8 + -0x10a8) == iVar4) {
            *(undefined4 *)(puVar8 + -0x1064) = 0;
            break;
          }
          *(int *)(puVar8 + -0x1090) = *(int *)(puVar8 + -0x1090) + 1;
        }
        if (*(int *)(puVar8 + -0x1064) != 0) {
          *(undefined8 *)(puVar8 + -0x10d0) = 0x15c86b;
          iVar4 = CSnapshotItem::Type(*(CSnapshotItem **)(puVar8 + -0x1060));
          *(int *)(puVar8 + -0x10b4) = iVar4;
          *(undefined8 *)(puVar8 + -0x10d0) = 0x15c879;
          CSnapshotItem::ID(*(CSnapshotItem **)(puVar8 + -0x1060));
          *(undefined8 *)(puVar8 + -0x10d0) = 0x15c890;
          pvVar6 = CSnapshotBuilder::NewItem
                             (*(CSnapshotBuilder **)(puVar8 + -0x10a8),*(int *)(puVar8 + -0x10ac),
                              *(int *)(puVar8 + -0x10b0),*(int *)(puVar8 + -0x10b4));
          *(void **)(puVar8 + -0x10b0) = pvVar6;
          *(undefined8 *)(puVar8 + -0x10d0) = 0x15c89f;
          CSnapshotItem::Data(*(CSnapshotItem **)(puVar8 + -0x1060));
          *(undefined8 *)(puVar8 + -0x10d0) = 0x15c8b0;
          mem_copy(*(void **)(puVar8 + -0x10c0),*(void **)(puVar8 + -0x10c8),
                   *(uint *)(puVar8 + -0x10cc));
        }
        *(int *)(puVar8 + -0x108c) = *(int *)(puVar8 + -0x108c) + 1;
      }
      *(undefined4 *)(puVar8 + -0x1094) = 0;
      while (*(int *)(puVar8 + -0x1094) < *(int *)(*(long *)(puVar8 + -0x1048) + 4)) {
        if (*(ulong *)(puVar8 + -0x1058) < *(long *)(puVar8 + -0x1050) + 8U) {
          *(undefined4 *)(puVar8 + -0x1014) = 0xffffffff;
          goto LAB_0015cbb1;
        }
        puVar1 = *(undefined4 **)(puVar8 + -0x1050);
        *(undefined4 **)(puVar8 + -0x1050) = puVar1 + 1;
        *(undefined4 *)(puVar8 + -0x1078) = *puVar1;
        if ((*(int *)(puVar8 + -0x1078) < 0) || (0x7fff < *(int *)(puVar8 + -0x1078))) {
          *(undefined4 *)(puVar8 + -0x1014) = 0xfffffffd;
          goto LAB_0015cbb1;
        }
        puVar1 = *(undefined4 **)(puVar8 + -0x1050);
        *(undefined4 **)(puVar8 + -0x1050) = puVar1 + 1;
        *(undefined4 *)(puVar8 + -0x1074) = *puVar1;
        if ((*(int *)(puVar8 + -0x1074) < 0) || (0xffff < *(int *)(puVar8 + -0x1074))) {
          *(undefined4 *)(puVar8 + -0x1014) = 0xfffffffd;
          goto LAB_0015cbb1;
        }
        if ((*(int *)(puVar8 + -0x1078) < 0x40) &&
           (*(short *)(*(long *)(puVar8 + -0x10a0) + (long)*(int *)(puVar8 + -0x1078) * 2) != 0)) {
          *(int *)(puVar8 + -0x1068) =
               (int)*(short *)(*(long *)(puVar8 + -0x10a0) + (long)*(int *)(puVar8 + -0x1078) * 2);
        }
        else {
          if (*(ulong *)(puVar8 + -0x1058) < *(long *)(puVar8 + -0x1050) + 4U) {
            *(undefined4 *)(puVar8 + -0x1014) = 0xfffffffe;
            goto LAB_0015cbb1;
          }
          if ((**(int **)(puVar8 + -0x1050) < 0) || (0x1fffffff < **(int **)(puVar8 + -0x1050))) {
            *(undefined4 *)(puVar8 + -0x1014) = 0xfffffffd;
            goto LAB_0015cbb1;
          }
          piVar7 = *(int **)(puVar8 + -0x1050);
          *(int **)(puVar8 + -0x1050) = piVar7 + 1;
          *(int *)(puVar8 + -0x1068) = *piVar7 << 2;
        }
        *(undefined8 *)(puVar8 + -0x10d0) = 0x15ca0f;
        iVar4 = RangeCheck(*(void **)(puVar8 + -0x1058),*(void **)(puVar8 + -0x1050),
                           *(int *)(puVar8 + -0x1068));
        if ((iVar4 != 0) || (*(int *)(puVar8 + -0x1068) < 0)) {
          *(undefined4 *)(puVar8 + -0x1014) = 0xfffffffd;
          goto LAB_0015cbb1;
        }
        *(uint *)(puVar8 + -0x107c) =
             *(int *)(puVar8 + -0x1078) << 0x10 | *(uint *)(puVar8 + -0x1074) & 0xffff;
        *(undefined8 *)(puVar8 + -0x10d0) = 0x15ca53;
        piVar7 = CSnapshotBuilder::GetItemData
                           (*(CSnapshotBuilder **)(puVar8 + -0x10b8),*(int *)(puVar8 + -0x10bc));
        *(int **)(puVar8 + -0x1088) = piVar7;
        if (*(long *)(puVar8 + -0x1088) == 0) {
          *(undefined8 *)(puVar8 + -0x10d0) = 0x15ca82;
          pvVar6 = CSnapshotBuilder::NewItem
                             (*(CSnapshotBuilder **)(puVar8 + -0x10a8),*(int *)(puVar8 + -0x10ac),
                              *(int *)(puVar8 + -0x10b0),*(int *)(puVar8 + -0x10b4));
          *(void **)(puVar8 + -0x1088) = pvVar6;
        }
        *(undefined8 *)(puVar8 + -0x10d0) = 0x15ca98;
        iVar4 = CSnapshot::GetItemIndex
                          (*(CSnapshot **)(puVar8 + -0x10a0),*(int *)(puVar8 + -0x10a4));
        *(int *)(puVar8 + -0x1080) = iVar4;
        if (*(int *)(puVar8 + -0x1080) == -1) {
          *(undefined8 *)(puVar8 + -0x10d0) = 0x15cb2e;
          mem_copy(*(void **)(puVar8 + -0x10c0),*(void **)(puVar8 + -0x10c8),
                   *(uint *)(puVar8 + -0x10cc));
          lVar2 = *(long *)(puVar8 + -0x10a0);
          *(int *)(lVar2 + 0x80 + (long)*(int *)(puVar8 + -0x1078) * 4) =
               *(int *)(puVar8 + -0x1068) * 8 +
               *(int *)(lVar2 + 0x80 + (long)*(int *)(puVar8 + -0x1078) * 4);
          *(int *)(lVar2 + 0x20080 + (long)*(int *)(puVar8 + -0x1078) * 4) =
               *(int *)(lVar2 + 0x20080 + (long)*(int *)(puVar8 + -0x1078) * 4) + 1;
        }
        else {
          *(undefined8 *)(puVar8 + -0x10d0) = 0x15cab4;
          pCVar5 = CSnapshot::GetItem(*(CSnapshot **)(puVar8 + -0x10b0),*(int *)(puVar8 + -0x10b4));
          *(undefined8 *)(puVar8 + -0x10d0) = 0x15cabc;
          CSnapshotItem::Data(pCVar5);
          *(undefined8 *)(puVar8 + -0x10c0) = *(undefined8 *)(puVar8 + -0x1088);
          *(undefined8 *)(puVar8 + -0x10d0) = 0x15cafe;
          UndiffItem(*(int **)(puVar8 + -0x10a0),*(int **)(puVar8 + -0x10a8),
                     *(int **)(puVar8 + -0x10b0),*(int *)(puVar8 + -0x10b4),
                     *(int **)(puVar8 + -0x10c0));
          *(int *)(*(long *)(puVar8 + -0x10a0) + 0x20080 + (long)*(int *)(puVar8 + -0x1078) * 4) =
               *(int *)(*(long *)(puVar8 + -0x10a0) + 0x20080 + (long)*(int *)(puVar8 + -0x1078) * 4
                       ) + 1;
        }
        *(long *)(puVar8 + -0x1050) =
             *(long *)(puVar8 + -0x1050) + (long)(*(int *)(puVar8 + -0x1068) / 4) * 4;
        *(int *)(puVar8 + -0x1094) = *(int *)(puVar8 + -0x1094) + 1;
      }
      *(undefined8 *)(puVar8 + -0x10d0) = 0x15cbaa;
      iVar4 = CSnapshotBuilder::Finish
                        ((CSnapshotBuilder *)(puVar8 + -0x1010),*(void **)(puVar8 + -0x1030));
      *(int *)(puVar8 + -0x1014) = iVar4;
    }
  }
LAB_0015cbb1:
  *(undefined4 *)(puVar8 + -0x10c4) = *(undefined4 *)(puVar8 + -0x1014);
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(puVar8 + 0xfff8)) {
    return *(int *)(puVar8 + -0x10c4);
  }
  *(undefined **)(puVar8 + -0x10d0) = &UNK_0015cbe3;
  __stack_chk_fail();
}

Assistant:

int CSnapshotDelta::UnpackDelta(const CSnapshot *pFrom, CSnapshot *pTo, const void *pSrcData, int DataSize)
{
	CSnapshotBuilder Builder;
	const CData *pDelta = (const CData *)pSrcData;
	const int *pData = (const int *)pDelta->m_pData;
	const int *pEnd = (const int *)(((const char *)pSrcData + DataSize));

	const CSnapshotItem *pFromItem;
	int Keep, ItemSize;
	const int *pDeleted;
	int ID, Type, Key;
	int FromIndex;
	int *pNewData;

	Builder.Init();

	// unpack deleted stuff
	pDeleted = pData;
	if(pDelta->m_NumDeletedItems < 0)
		return -1;
	pData += pDelta->m_NumDeletedItems;
	if(pData > pEnd)
		return -1;

	// copy all non deleted stuff
	for(int i = 0; i < pFrom->NumItems(); i++)
	{
		// dbg_assert(0, "fail!");
		pFromItem = pFrom->GetItem(i);
		ItemSize = pFrom->GetItemSize(i);
		Keep = 1;
		for(int d = 0; d < pDelta->m_NumDeletedItems; d++)
		{
			if(pDeleted[d] == pFromItem->Key())
			{
				Keep = 0;
				break;
			}
		}

		if(Keep)
		{
			// keep it
			mem_copy(
				Builder.NewItem(pFromItem->Type(), pFromItem->ID(), ItemSize),
				pFromItem->Data(), ItemSize);
		}
	}

	// unpack updated stuff
	for(int i = 0; i < pDelta->m_NumUpdateItems; i++)
	{
		if(pData+2 > pEnd)
			return -1;

		Type = *pData++;
		if(Type < 0 || Type > CSnapshot::MAX_TYPE)
			return -3;

		ID = *pData++;
		if(ID < 0 || ID > CSnapshot::MAX_ID)
			return -3;

		if(Type < MAX_NETOBJSIZES && m_aItemSizes[Type])
			ItemSize = m_aItemSizes[Type];
		else
		{
			if(pData+1 > pEnd)
				return -2;
			if(*pData < 0 || *pData > INT_MAX / 4)
				return -3;
			ItemSize = (*pData++) * 4;
		}

		if(RangeCheck(pEnd, pData, ItemSize) || ItemSize < 0) return -3;

		Key = (Type<<16)|(ID&0xffff);

		// create the item if needed
		pNewData = Builder.GetItemData(Key);
		if(!pNewData)
			pNewData = (int *)Builder.NewItem(Key>>16, Key&0xffff, ItemSize);

		//if(range_check(pEnd, pNewData, ItemSize)) return -4;

		FromIndex = pFrom->GetItemIndex(Key);
		if(FromIndex != -1)
		{
			// we got an update so we need to apply the diff
			UndiffItem(pFrom->GetItem(FromIndex)->Data(), pData, pNewData, ItemSize / 4, &m_aSnapshotDataRate[Type]);
			m_aSnapshotDataUpdates[Type]++;
		}
		else // no previous, just copy the pData
		{
			mem_copy(pNewData, pData, ItemSize);
			m_aSnapshotDataRate[Type] += ItemSize * 8;
			m_aSnapshotDataUpdates[Type]++;
		}

		pData += ItemSize/4;
	}

	// finish up
	return Builder.Finish(pTo);
}